

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O2

bool __thiscall
dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)0>::check
          (property_type_checker<(dtc::fdt::property_value::value_type)0> *this,device_tree *param_1
          ,node_ptr *param_2,property_ptr *p)

{
  element_type *peVar1;
  pointer ppVar2;
  bool bVar3;
  pointer this_00;
  
  peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (peVar1->values).
            super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (peVar1->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == ppVar2) {
      peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      return (peVar1->values).
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (peVar1->values).
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar3 = property_value::is_string(this_00);
    if ((!bVar3) && (bVar3 = property_value::is_string_list(this_00), !bVar3)) break;
    this_00 = this_00 + 1;
  }
  return false;
}

Assistant:

virtual bool check(device_tree *, const node_ptr &, property_ptr p)
	{
		for (property::value_iterator i=p->begin(),e=p->end() ; i!=e ;
		     ++i)
		{
			if (!(i->is_string() || i->is_string_list()))
			{
				return false;
			}
		}
		return p->begin() != p->end();
	}